

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Gia_Man_t *
Str_NtkBalance(Gia_Man_t *pGia,Str_Ntk_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,
              int fVerbose)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  uint *puVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  uint uVar14;
  Str_Obj_t *pSVar15;
  ulong uVar16;
  int iVar17;
  Str_Obj_t *pObj;
  float fVar18;
  uint local_58;
  
  if (0xf < nLutSize) {
    __assert_fail("nLutSize < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50e,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50f,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  p_00 = Gia_ManStart(pGia->nObjs);
  pcVar2 = pGia->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = pGia->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  uVar4 = p_00->nObjsAlloc;
  puVar8 = (uint *)calloc((long)(int)uVar4,4);
  p_00->pMuxes = puVar8;
  if ((p_00->vCopies).nCap < (int)uVar4) {
    piVar9 = (p_00->vCopies).pArray;
    sVar6 = (long)(int)uVar4 << 2;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(sVar6);
    }
    else {
      piVar9 = (int *)realloc(piVar9,sVar6);
    }
    (p_00->vCopies).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vCopies).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vCopies).pArray,0xff,(ulong)uVar4 * 4);
  }
  (p_00->vCopies).nSize = uVar4;
  if (p_00->vSuper == (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    pVVar10->nCap = 1000;
    pVVar10->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar10->pArray = piVar9;
    p_00->vSuper = pVVar10;
  }
  if (p_00->vStore == (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    pVVar10->nCap = 1000;
    pVVar10->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar10->pArray = piVar9;
    p_00->vStore = pVVar10;
  }
  iVar5 = p_00->nObjsAlloc;
  iVar17 = iVar5 * 2;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar13 = iVar17;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar13;
  if (iVar13 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar10->pArray = piVar9;
  pVVar10->nSize = iVar17;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)iVar5 << 3);
  }
  Gia_ManHashStart(p_00);
  if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
    Tim_ManInitPiArrivalAll((Tim_Man_t *)pGia->pManTime,17.0);
    Tim_ManIncrementTravId((Tim_Man_t *)pGia->pManTime);
  }
  iVar5 = p->nObjs;
  if (iVar5 < 1) {
    uVar16 = 0;
  }
  else {
    pSVar15 = p->pObjs;
    local_58 = 0;
    pObj = pSVar15;
    do {
      uVar4 = *(uint *)pObj & 0xf;
      switch(uVar4) {
      case 1:
switchD_007dbc90_caseD_1:
        pObj->iCopy = 0;
        if (pVVar10->nSize < 1) {
LAB_007dc252:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *pVVar10->pArray = 0x11;
        break;
      case 2:
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar16 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar16 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) {
LAB_007dc1f5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar11 < pGVar3) || (iVar5 = p_00->nObjs, pGVar3 + iVar5 <= pGVar11))
        goto LAB_007dc1f5;
        iVar17 = (int)((long)pGVar11 - (long)pGVar3 >> 2);
        uVar4 = iVar17 * -0x55555555;
        iVar17 = iVar17 * 0x55555556;
        pObj->iCopy = iVar17;
        if ((Tim_Man_t *)pGia->pManTime == (Tim_Man_t *)0x0) {
          iVar5 = 0x11;
        }
        else {
          if (iVar17 < 0) goto LAB_007dc1d6;
          if (iVar5 <= (int)(uVar4 & 0x7fffffff)) goto LAB_007dc271;
          if (-1 < (int)*(undefined8 *)(pGVar3 + (uVar4 & 0x7fffffff))) goto LAB_007dc290;
          fVar18 = Tim_ManGetCiArrival((Tim_Man_t *)pGia->pManTime,
                                       (uint)((ulong)*(undefined8 *)(pGVar3 + (uVar4 & 0x7fffffff))
                                             >> 0x20) & 0x1fffffff);
          iVar5 = (int)fVar18;
        }
        if (pObj->iCopy < 0) goto LAB_007dc1d6;
        uVar4 = (uint)pObj->iCopy >> 1;
        if (pVVar10->nSize <= (int)uVar4) goto LAB_007dc252;
        pVVar10->pArray[uVar4] = iVar5;
        break;
      case 3:
      case 4:
        Str_NtkBalanceMulti(p_00,p,pObj,pVVar10,nLutSize);
        break;
      case 5:
        if (fUseMuxes != 0) {
          uVar14 = pObj->iTop;
          uVar16 = (ulong)uVar14;
          if (-1 < (int)uVar14) {
            if (uVar16 == 0) {
              iVar5 = 0;
              iVar17 = 0;
            }
            else {
              if (iVar5 <= (int)uVar14) goto LAB_007dc214;
              if (iVar5 <= pSVar15[uVar16].iTop) goto LAB_007dc214;
              iVar17 = (int)((long)pSVar15 + (uVar16 * 0x10 - (long)pObj) >> 4) + 1;
              iVar5 = (int)((((long)pSVar15 + ((long)pSVar15[uVar16].iTop * 0x10 - (long)pObj) >> 4)
                            + 1) / (long)iVar17);
            }
            if (iVar17 * iVar5 < 2) {
              __assert_fail("nGroups * nMuxes >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                            ,0x532,
                            "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                           );
            }
            Str_NtkBalanceMux(p_00,p,pObj,pVVar10,nLutSize,iVar5,iVar17,fRecursive,fOptArea,fVerbose
                             );
            pObj = pObj + (long)(iVar17 * iVar5) + -1;
            break;
          }
        }
        if (uVar4 == 1) goto switchD_007dbc90_caseD_1;
        if (uVar4 == 7) goto switchD_007dbc90_caseD_7;
        if (uVar4 != 5) {
switchD_007dbc90_caseD_6:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x548,
                        "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                       );
        }
        iVar17 = pObj->iOffset;
        if ((long)iVar17 < -2) goto LAB_007dc1b7;
        iVar13 = (p->vFanins).nSize;
        if (iVar13 <= (int)(iVar17 + 2U)) goto LAB_007dc1b7;
        piVar9 = (p->vFanins).pArray;
        uVar4 = piVar9[iVar17 + 2U];
        if ((int)uVar4 < 0) goto LAB_007dc1d6;
        if (iVar5 <= (int)(uVar4 >> 1)) goto LAB_007dc214;
        if (pSVar15[uVar4 >> 1].iCopy < 0) goto LAB_007dc233;
        if ((iVar17 == -2) || (iVar13 <= (int)(iVar17 + 1U))) goto LAB_007dc1b7;
        uVar14 = piVar9[iVar17 + 1U];
        if ((int)uVar14 < 0) goto LAB_007dc1d6;
        if (iVar5 <= (int)(uVar14 >> 1)) goto LAB_007dc214;
        if (pSVar15[uVar14 >> 1].iCopy < 0) goto LAB_007dc233;
        if ((iVar17 < 0) || (iVar13 <= iVar17)) goto LAB_007dc1b7;
        uVar1 = piVar9[iVar17];
        if ((int)uVar1 < 0) goto LAB_007dc1d6;
        if (iVar5 <= (int)(uVar1 >> 1)) goto LAB_007dc214;
        if (pSVar15[uVar1 >> 1].iCopy < 0) goto LAB_007dc233;
        uVar4 = Gia_ManHashMuxReal(p_00,pSVar15[uVar4 >> 1].iCopy ^ uVar4 & 1,
                                   pSVar15[uVar14 >> 1].iCopy ^ uVar14 & 1,
                                   pSVar15[uVar1 >> 1].iCopy ^ uVar1 & 1);
        pObj->iCopy = uVar4;
        if ((int)uVar4 < 0) goto LAB_007dc1d6;
        Str_ObjDelay(p_00,uVar4 >> 1,nLutSize,pVVar10);
        break;
      default:
        goto switchD_007dbc90_caseD_6;
      case 7:
switchD_007dbc90_caseD_7:
        iVar17 = pObj->iOffset;
        if (((long)iVar17 < 0) || ((p->vFanins).nSize <= iVar17)) {
LAB_007dc1b7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = (p->vFanins).pArray[iVar17];
        if ((int)uVar4 < 0) {
LAB_007dc1d6:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (iVar5 <= (int)(uVar4 >> 1)) {
LAB_007dc214:
          __assert_fail("i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
        }
        if (pSVar15[uVar4 >> 1].iCopy < 0) {
LAB_007dc233:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar4 = Gia_ManAppendCo(p_00,pSVar15[uVar4 >> 1].iCopy ^ uVar4 & 1);
        pObj->iCopy = uVar4;
        iVar5 = pObj->iOffset;
        if (((long)iVar5 < 0) || ((p->vFanins).nSize <= iVar5)) goto LAB_007dc1b7;
        uVar14 = (p->vFanins).pArray[iVar5];
        if ((int)uVar14 < 0) goto LAB_007dc1d6;
        uVar14 = uVar14 >> 1;
        if (p->nObjs <= (int)uVar14) goto LAB_007dc214;
        uVar14 = p->pObjs[uVar14].iCopy;
        if ((int)uVar14 < 0) goto LAB_007dc233;
        uVar14 = uVar14 >> 1;
        if (pVVar10->nSize <= (int)uVar14) goto LAB_007dc1b7;
        uVar14 = pVVar10->pArray[uVar14];
        if ((int)local_58 <= (int)uVar14) {
          local_58 = uVar14;
        }
        if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
          if ((int)uVar4 < 0) goto LAB_007dc1d6;
          if (p_00->nObjs <= (int)(uVar4 >> 1)) {
LAB_007dc271:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (-1 < (int)*(undefined8 *)(p_00->pObjs + (uVar4 >> 1))) {
LAB_007dc290:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          Tim_ManSetCoArrival((Tim_Man_t *)pGia->pManTime,
                              (uint)((ulong)*(undefined8 *)(p_00->pObjs + (uVar4 >> 1)) >> 0x20) &
                              0x1fffffff,(float)(int)uVar14);
        }
      }
      pObj = pObj + 1;
      pSVar15 = p->pObjs;
      iVar5 = p->nObjs;
    } while ((int)((ulong)((long)pObj - (long)pSVar15) >> 4) < iVar5);
    uVar16 = (ulong)(local_58 >> 4);
  }
  if (fVerbose != 0) {
    printf("Max delay = %d.  Old objs = %d.  New objs = %d.\n",uVar16,(ulong)(uint)pGia->nObjs,
           (ulong)(uint)p_00->nObjs);
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  piVar9 = (p_00->vCopies).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p_00->vCopies).pArray = (int *)0x0;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGia->nRegs);
  pGVar12 = Gia_ManDupNoMuxes(p_00,0);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Str_NtkBalance( Gia_Man_t * pGia, Str_Ntk_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vDelay;
    Str_Obj_t * pObj; 
    int nGroups, nMuxes, CioId;
    int arrTime, Delay = 0;
    assert( nLutSize < 16 );
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Vec_IntFill( &pNew->vCopies, pNew->nObjsAlloc, -1 );
    if ( pNew->vSuper == NULL )
        pNew->vSuper = Vec_IntAlloc( 1000 );
    if ( pNew->vStore == NULL )
        pNew->vStore = Vec_IntAlloc( 1000 );
    vDelay = Vec_IntStart( 2*pNew->nObjsAlloc );
    Gia_ManHashStart( pNew );
    if ( pGia->pManTime != NULL ) // Tim_Man with unit delay 16
    {
        Tim_ManInitPiArrivalAll( (Tim_Man_t *)pGia->pManTime, 17 );
        Tim_ManIncrementTravId( (Tim_Man_t *)pGia->pManTime );
    }
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
        {
            pObj->iCopy = Gia_ManAppendCi( pNew );
            arrTime = 17;
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                arrTime = (int)Tim_ManGetCiArrival( (Tim_Man_t *)pGia->pManTime, CioId );
            }
            Vec_IntWriteEntry( vDelay, Abc_Lit2Var(pObj->iCopy), arrTime );
        }
        else if ( pObj->Type == STR_AND || pObj->Type == STR_XOR )
            Str_NtkBalanceMulti( pNew, p, pObj, vDelay, nLutSize );
        else if ( pObj->Type == STR_MUX && pObj->iTop >= 0 && fUseMuxes )
        {
            Str_ObjReadGroup( p, pObj, &nGroups, &nMuxes );
            assert( nGroups * nMuxes >= 2 );
            Str_NtkBalanceMux( pNew, p, pObj, vDelay, nLutSize, nGroups, nMuxes, fRecursive, fOptArea, fVerbose );
            pObj += nGroups * nMuxes - 1;
        }
        else if ( pObj->Type == STR_MUX )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
        else if ( pObj->Type == STR_PO )
        {
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
            arrTime = Vec_IntEntry(vDelay, Abc_Lit2Var(Str_ObjFaninCopy(p, pObj, 0)) );
            Delay = Abc_MaxInt( Delay, arrTime );
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                Tim_ManSetCoArrival( (Tim_Man_t *)pGia->pManTime, CioId, (float)arrTime );
            }
        }
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0, Vec_IntWriteEntry(vDelay, 0, 17);
        else assert( 0 );
    }
    if ( fVerbose )
        printf( "Max delay = %d.  Old objs = %d.  New objs = %d.\n", Delay >> 4, Gia_ManObjNum(pGia), Gia_ManObjNum(pNew) );
    Vec_IntFree( vDelay );
    ABC_FREE( pNew->vCopies.pArray );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManDupNoMuxes( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
//    if ( pGia->pManTime != NULL )
//        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pGia->pManTime, 0 );
    return pNew;
}